

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_heat_maps_test.cpp
# Opt level: O2

void __thiscall
check_arythmetic_operations_for_heat_maps::test_method
          (check_arythmetic_operations_for_heat_maps *this)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_590;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_578;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  shared_count sStack_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> p;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> q;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> sum_template;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> sum;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  multiply_by_scalar_template;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  difference_template;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
  multiply_by_scalar;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> difference;
  
  Gudhi::Persistence_representations::create_Gaussian_filter(&filter,0x1e,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_578,&filter);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps(&p,"data/file_with_diagram",&local_578,false,1000,0.0,1.0,0xffffffff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_578);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_590,&filter);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps(&q,"data/file_with_diagram_1",&local_590,false,1000,0.0,1.0,0xffffffff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_590);
  Gudhi::Persistence_representations::operation_on_pair_of_heat_maps<std::plus<double>>
            (&sum,(Persistence_representations *)&p,&q);
  Gudhi::Persistence_representations::operation_on_pair_of_heat_maps<std::minus<double>>
            (&difference,(Persistence_representations *)&p,&q);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  multiply_by_scalar(&multiply_by_scalar,&p,2.0);
  sum_template.discrete = true;
  sum_template.erase_below_diagonal = false;
  sum_template.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  sum_template.kernel.super__Function_base._M_functor._8_8_ = 0;
  sum_template.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
  sum_template.kernel._M_invoker = (_Invoker_type)0x0;
  sum_template.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  sum_template.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  sum_template.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sum_template.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sum_template.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sum_template.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sum_template.min_ = 0.0;
  sum_template.max_ = 0.0;
  sum_template.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sum_template.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sum_template.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sum_template.number_of_functions_for_vectorization = 1;
  sum_template.number_of_functions_for_projections_to_reals = 1;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file(&sum_template,"data/heat_map_sum");
  difference_template.discrete = true;
  difference_template.erase_below_diagonal = false;
  difference_template.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  difference_template.kernel.super__Function_base._M_functor._8_8_ = 0;
  difference_template.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
  difference_template.kernel._M_invoker = (_Invoker_type)0x0;
  difference_template.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  difference_template.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  difference_template.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  difference_template.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  difference_template.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  difference_template.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  difference_template.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  difference_template.min_ = 0.0;
  difference_template.max_ = 0.0;
  difference_template.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  difference_template.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  difference_template.number_of_functions_for_vectorization = 1;
  difference_template.number_of_functions_for_projections_to_reals = 1;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file(&difference_template,"data/heat_map_difference");
  multiply_by_scalar_template.discrete = true;
  multiply_by_scalar_template.erase_below_diagonal = false;
  multiply_by_scalar_template.kernel.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  multiply_by_scalar_template.kernel.super__Function_base._M_functor._8_8_ = 0;
  multiply_by_scalar_template.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
  multiply_by_scalar_template.kernel._M_invoker = (_Invoker_type)0x0;
  multiply_by_scalar_template.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  multiply_by_scalar_template.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  multiply_by_scalar_template.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  multiply_by_scalar_template.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  multiply_by_scalar_template.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  multiply_by_scalar_template.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  multiply_by_scalar_template.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  multiply_by_scalar_template.min_ = 0.0;
  multiply_by_scalar_template.max_ = 0.0;
  multiply_by_scalar_template.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  multiply_by_scalar_template.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  multiply_by_scalar_template.number_of_functions_for_vectorization = 1;
  multiply_by_scalar_template.number_of_functions_for_projections_to_reals = 1;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file(&multiply_by_scalar_template,"data/heat_map_multiply_by_scalar");
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_500,0xc0);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::operator==
            (&sum,&sum_template);
  sStack_538.pi_ = (sp_counted_base *)0x0;
  local_520 = "sum == sum_template";
  local_518 = "";
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_528 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_538);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&multiply_by_scalar_template);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&difference_template);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&sum_template);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&multiply_by_scalar);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&difference);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&sum);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&q);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&p);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&filter);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_arythmetic_operations_for_heat_maps) {
  std::vector<std::vector<double> > filter = create_Gaussian_filter(30, 1);
  Persistence_heat_maps<constant_scaling_function> p("data/file_with_diagram", filter, false, 1000, 0, 1);
  Persistence_heat_maps<constant_scaling_function> q("data/file_with_diagram_1", filter, false, 1000, 0, 1);

  Persistence_heat_maps<constant_scaling_function> sum = p + q;
  Persistence_heat_maps<constant_scaling_function> difference = p - q;
  Persistence_heat_maps<constant_scaling_function> multiply_by_scalar = 2 * p;

  // sum.print_to_file( "sum" );
  // difference.print_to_file( "difference" );
  // multiply_by_scalar.print_to_file( "multiply_by_scalar" );

  Persistence_heat_maps<constant_scaling_function> sum_template;
  sum_template.load_from_file("data/heat_map_sum");
  Persistence_heat_maps<constant_scaling_function> difference_template;
  difference_template.load_from_file("data/heat_map_difference");
  Persistence_heat_maps<constant_scaling_function> multiply_by_scalar_template;
  multiply_by_scalar_template.load_from_file("data/heat_map_multiply_by_scalar");

  BOOST_CHECK(sum == sum_template);
}